

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O1

int ExUtilInitCommandLineArguments(int argc,char **argv,CommandLineArguments *args)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  long lVar4;
  size_t size;
  uint8_t *data;
  size_t local_30;
  uint8_t *local_28;
  
  iVar1 = 0;
  if (argv != (char **)0x0 && args != (CommandLineArguments *)0x0) {
    args->argc = argc;
    args->argv = argv;
    (args->argv_data).bytes = (uint8_t *)0x0;
    (args->argv_data).size = 0;
    args->own_argv = 0;
    iVar1 = 1;
    if ((argc == 1) && (**argv != '-')) {
      iVar1 = ImgIoUtilReadFile(*argv,&local_28,&local_30);
      if (iVar1 != 0) {
        (args->argv_data).bytes = local_28;
        (args->argv_data).size = local_30;
        args->own_argv = 1;
        ppcVar2 = (char **)WebPMalloc(0x20000);
        args->argv = ppcVar2;
        if (ppcVar2 == (char **)0x0) {
          ExUtilDeleteCommandLineArguments(args);
        }
        else {
          pcVar3 = strtok((char *)(args->argv_data).bytes," \t\r\n\f\v");
          lVar4 = 0;
          while( true ) {
            if (pcVar3 == (char *)0x0) {
              args->argc = (int)lVar4;
              return 1;
            }
            if (lVar4 == 0x4000) break;
            args->argv[lVar4] = pcVar3;
            lVar4 = lVar4 + 1;
            pcVar3 = strtok((char *)0x0," \t\r\n\f\v");
          }
          ExUtilInitCommandLineArguments_cold_1();
        }
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ExUtilInitCommandLineArguments(int argc, const char* argv[],
                                   CommandLineArguments* const args) {
  if (args == NULL || argv == NULL) return 0;
  ResetCommandLineArguments(argc, argv, args);
  if (argc == 1 && argv[0][0] != '-') {
    char* cur;
    const char sep[] = " \t\r\n\f\v";

#if defined(_WIN32) && defined(_UNICODE)
    fprintf(stderr,
            "Error: Reading arguments from a file is a feature unavailable "
            "with Unicode binaries.\n");
    return 0;
#endif

    if (!ExUtilReadFileToWebPData(argv[0], &args->argv_data)) {
      return 0;
    }
    args->own_argv = 1;
    args->argv = (const char**)WebPMalloc(MAX_ARGC * sizeof(*args->argv));
    if (args->argv == NULL) {
      ExUtilDeleteCommandLineArguments(args);
      return 0;
    }

    argc = 0;
    for (cur = strtok((char*)args->argv_data.bytes, sep);
         cur != NULL;
         cur = strtok(NULL, sep)) {
      if (argc == MAX_ARGC) {
        fprintf(stderr, "ERROR: Arguments limit %d reached\n", MAX_ARGC);
        ExUtilDeleteCommandLineArguments(args);
        return 0;
      }
      assert(strlen(cur) != 0);
      args->argv[argc++] = cur;
    }
    args->argc = argc;
  }
  return 1;
}